

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

void __thiscall Util::BlockShuffle(Util *this,array<int,_9UL> *vec)

{
  reference pvVar1;
  reference pvVar2;
  int j;
  array<int,_3UL> block;
  int i;
  array<int,_3UL> blocks;
  size_type in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 local_30;
  undefined4 local_20;
  
  std::array<int,_3UL>::begin((array<int,_3UL> *)0x109d68);
  std::array<int,_3UL>::end((array<int,_3UL> *)0x109d77);
  std::
  shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((int *)this,vec->_M_elems,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)blocks._M_elems._4_8_);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    std::array<int,_3UL>::begin((array<int,_3UL> *)0x109dc3);
    std::array<int,_3UL>::end((array<int,_3UL> *)0x109dd2);
    std::
    shuffle<int*,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
              ((int *)this,vec->_M_elems,
               (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                *)blocks._M_elems._4_8_);
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pvVar1 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb0 = *pvVar1 * 3;
      pvVar1 = std::array<int,_3UL>::operator[]
                         ((array<int,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb0 + *pvVar1;
      pvVar2 = std::array<int,_9UL>::operator[]
                         ((array<int,_9UL> *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
      *pvVar2 = in_stack_ffffffffffffffb4;
    }
  }
  return;
}

Assistant:

void Util::BlockShuffle(array<int, 9> *vec) {
    array<int, 3> blocks{0, 1, 2};
    shuffle(blocks.begin(), blocks.end(), rng_);
    for (int i = 0; i < 3; i++) {
        array<int, 3> block{0, 1, 2};
        shuffle(block.begin(), block.end(), rng_);
        for (int j = 0; j < 3; j++) {
            (*vec)[i * 3 + j] = blocks[i] * 3 + block[j];
        }
    }
}